

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_connection.cc
# Opt level: O1

void __thiscall
iqnet::ssl::Reaction_connection::reg_recv(Reaction_connection *this,char *buf,size_t len)

{
  int iVar1;
  
  this->state = READING;
  this->recv_buf = buf;
  this->buf_len = len;
  (*this->reactor->_vptr_Reactor_base[2])(this->reactor,this,1);
  iVar1 = SSL_pending((SSL *)(this->super_Connection).ssl);
  if (iVar1 != 0) {
    (*this->reactor->_vptr_Reactor_base[5])(this->reactor,this,1);
    return;
  }
  return;
}

Assistant:

void ssl::Reaction_connection::reg_recv( char* buf, size_t len )
{
  state = READING;
  recv_buf = buf;
  buf_len = len;
  reactor->register_handler( this, Reactor_base::INPUT );

  if( SSL_pending(ssl) )
    reactor->fake_event( this, Reactor_base::INPUT );
}